

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O2

void * __thiscall sc_dt::scfx_rep::operator_new(scfx_rep *this,size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if (this == (scfx_rep *)0x28) {
    puVar2 = list;
    if (list == (undefined8 *)0x0) {
      puVar2 = (undefined8 *)operator_new__(0xa000);
      for (lVar3 = 0; lVar3 != 0x9fd8; lVar3 = lVar3 + 0x28) {
        *(long *)((long)puVar2 + lVar3) = (long)puVar2 + lVar3 + 0x28;
      }
      puVar2[0x13fb] = 0;
    }
    list = (undefined8 *)*puVar2;
    return puVar2;
  }
  pvVar1 = ::operator_new((ulong)this);
  return pvVar1;
}

Assistant:

void*
scfx_rep::operator new( std::size_t size )
{
    const int ALLOC_SIZE = 1024;

    if( size != sizeof( scfx_rep ) )
	return ::operator new( size );

    if( ! list )
    {
	list = new scfx_rep_node[ALLOC_SIZE];
	for( int i = 0; i < ALLOC_SIZE - 1; i ++ )
	    list[i].next = list + i + 1;
	list[ALLOC_SIZE - 1].next = 0;
    }

    scfx_rep* ptr = reinterpret_cast<scfx_rep*>( list->data );
    list = list->next;

    return ptr;
}